

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O2

Node * __thiscall
google::protobuf::Map<unsigned_long,_proto2_unittest::TestIntIntMap>::CloneFromOther
          (Map<unsigned_long,_proto2_unittest::TestIntIntMap> *this,
          Map<unsigned_long,_proto2_unittest::TestIntIntMap> *other)

{
  TestIntIntMap *from;
  TestIntIntMap *this_00;
  NodeBase *pNVar1;
  Node *pNVar2;
  Node *pNVar3;
  const_iterator __begin0;
  
  internal::UntypedMapBase::begin(&__begin0.super_UntypedMapIterator,(UntypedMapBase *)other);
  pNVar3 = (Node *)0x0;
  while (pNVar1 = __begin0.super_UntypedMapIterator.node_,
        __begin0.super_UntypedMapIterator.node_ != (NodeBase *)0x0) {
    from = (TestIntIntMap *)(__begin0.super_UntypedMapIterator.node_ + 2);
    pNVar2 = (Node *)internal::UntypedMapBase::AllocNode((UntypedMapBase *)this,0x58);
    (pNVar2->kv).first = (unsigned_long)pNVar1[1].next;
    this_00 = &(pNVar2->kv).second;
    proto2_unittest::TestIntIntMap::TestIntIntMap
              (this_00,(this->super_KeyMapBase<unsigned_long>).super_UntypedMapBase.arena_);
    proto2_unittest::TestIntIntMap::CopyFrom(this_00,from);
    (pNVar2->super_KeyNode).super_NodeBase.next = (NodeBase *)pNVar3;
    internal::UntypedMapIterator::PlusPlus(&__begin0.super_UntypedMapIterator);
    pNVar3 = pNVar2;
  }
  return pNVar3;
}

Assistant:

PROTOBUF_NOINLINE Node* CloneFromOther(const Map& other) {
    Node* head = nullptr;
    for (const auto& [key, value] : other) {
      Node* new_node;
      if constexpr (std::is_base_of_v<MessageLite, mapped_type>) {
        new_node = CreateNode(key);
        new_node->kv.second = value;
      } else {
        new_node = CreateNode(key, value);
      }
      new_node->next = head;
      head = new_node;
    }
    return head;
  }